

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RegularExpression.hpp
# Opt level: O1

Op * __thiscall
xercesc_4_0::RegularExpression::compileClosure
          (RegularExpression *this,Token *token,Op *next,bool reverse,tokType tkType)

{
  bool bVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  undefined4 extraout_var;
  ChildOp *this_01;
  Op *pOVar5;
  XMLSize_t XVar6;
  ChildOp *pCVar7;
  uint id;
  int iVar8;
  Token *this_00;
  
  iVar2 = (*token->_vptr_Token[2])(token,0);
  this_00 = (Token *)CONCAT44(extraout_var,iVar2);
  iVar2 = (*token->_vptr_Token[4])(token);
  iVar3 = (*token->_vptr_Token[5])(token);
  if (iVar2 == iVar3 && -1 < iVar2) {
    if (0 < iVar2) {
      do {
        next = compile(this,this_00,next,reverse);
        iVar2 = iVar2 + -1;
      } while (iVar2 != 0);
    }
  }
  else {
    iVar4 = 0;
    if (0 < iVar2) {
      iVar4 = iVar2;
    }
    if (iVar3 < 1) {
      iVar4 = 0;
    }
    iVar8 = iVar3 - iVar4;
    if (iVar8 == 0 || iVar3 < iVar4) {
      if (tkType == T_NONGREEDYCLOSURE) {
        this_01 = OpFactory::createNonGreedyClosureOp(&this->fOpFactory);
      }
      else {
        XVar6 = Token::getMinLength(this_00);
        if (XVar6 == 0) {
          id = this->fNoClosures;
          this->fNoClosures = id + 1;
        }
        else {
          id = 0xffffffff;
        }
        this_01 = OpFactory::createClosureOp(&this->fOpFactory,id);
      }
      (this_01->super_Op).fNextOp = next;
      if ((next == (Op *)0x0) ||
         (bVar1 = doTokenOverlap(this,next,this_00), pCVar7 = this_01, !bVar1)) {
        (this_01->super_Op).fOpType = (tkType == T_NONGREEDYCLOSURE) + O_FINITE_CLOSURE;
        pCVar7 = (ChildOp *)0x0;
      }
      pOVar5 = compile(this,this_00,&pCVar7->super_Op,reverse);
      ChildOp::setChild(this_01,pOVar5);
    }
    else {
      pCVar7 = (ChildOp *)next;
      do {
        this_01 = OpFactory::createQuestionOp(&this->fOpFactory,tkType == T_NONGREEDYCLOSURE);
        (this_01->super_Op).fNextOp = next;
        pOVar5 = compile(this,this_00,&pCVar7->super_Op,reverse);
        ChildOp::setChild(this_01,pOVar5);
        iVar8 = iVar8 + -1;
        pCVar7 = this_01;
      } while (iVar8 != 0);
    }
    next = &this_01->super_Op;
    if (0 < iVar2) {
      do {
        next = compile(this,this_00,next,reverse);
        iVar2 = iVar2 + -1;
      } while (iVar2 != 0);
    }
  }
  return &((ChildOp *)next)->super_Op;
}

Assistant:

inline Op* RegularExpression::compileClosure(const Token* const token,
                                               Op* const next,
                                               const bool reverse,
                                               const Token::tokType tkType) {

      Op*    ret      = 0;
      Token* childTok = token->getChild(0);
      int    min      = token->getMin();
      int    max      = token->getMax();

      if (min >= 0 && min == max) {

          ret = next;
          for (int i=0; i< min; i++) {
              ret = compile(childTok, ret, reverse);
          }

          return ret;
      }

      if (min > 0 && max > 0)
          max -= min;

      if (max > 0) {

          ret = next;
          for (int i=0; i<max; i++) {

              ChildOp* childOp = fOpFactory.createQuestionOp(
                  tkType == Token::T_NONGREEDYCLOSURE);

              childOp->setNextOp(next);
              childOp->setChild(compile(childTok, ret, reverse));
              ret = childOp;
          }
      }
      else {

          ChildOp* childOp = 0;

          if (tkType == Token::T_NONGREEDYCLOSURE) {
              childOp = fOpFactory.createNonGreedyClosureOp();
          }
          else {

              if (childTok->getMinLength() == 0)
                  childOp = fOpFactory.createClosureOp(fNoClosures++);
              else
                  childOp = fOpFactory.createClosureOp(-1);
          }

          childOp->setNextOp(next);
          if(next==NULL || !doTokenOverlap(next, childTok))
          {
              childOp->setOpType(tkType == Token::T_NONGREEDYCLOSURE?Op::O_FINITE_NONGREEDYCLOSURE:Op::O_FINITE_CLOSURE);
              childOp->setChild(compile(childTok, NULL, reverse));
          }
          else
          {
              childOp->setChild(compile(childTok, childOp, reverse));
          }
          ret = childOp;
      }

      if (min > 0) {

          for (int i=0; i< min; i++) {
              ret = compile(childTok, ret, reverse);
          }
      }

      return ret;
  }